

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.cpp
# Opt level: O0

string * __thiscall pbrt::HGPhaseFunction::ToString_abi_cxx11_(HGPhaseFunction *this)

{
  string *in_RDI;
  float *in_stack_00000010;
  char *in_stack_00000018;
  
  StringPrintf<float_const&>(in_stack_00000018,in_stack_00000010);
  return in_RDI;
}

Assistant:

std::string HGPhaseFunction::ToString() const {
    return StringPrintf("[ HGPhaseFunction g: %f ]", g);
}